

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CreateGraphicalElement
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZGraphMesh *grmesh,int dimension)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TPZGeoEl *pTVar4;
  long *plVar5;
  long lVar6;
  TPZGraphElQ2dd *this_00;
  TPZGraphElT3d *this_01;
  TPZGraphEl1dd *this_02;
  TPZGraphElT2dMapped *this_03;
  TPZGraphElPrismMapped *this_04;
  TPZGraphElPyramidMapped *this_05;
  TPZGraphElQ3dd *this_06;
  
  pTVar4 = TPZCompEl::Reference((TPZCompEl *)this);
  iVar2 = (**(code **)(*(long *)pTVar4 + 0x210))(pTVar4);
  if ((iVar2 == dimension) &&
     ((plVar5 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl
                                    + 0xb8))(this), plVar5 == (long *)0x0 ||
      (lVar6 = __dynamic_cast(plVar5,&TPZMaterial::typeinfo,&TPZBndCond::typeinfo,0xfffffffffffffffe
                             ), lVar6 == 0)))) {
    iVar2 = (**(code **)(*plVar5 + 0x58))(plVar5);
    iVar3 = (**(code **)(*(long *)pTVar4 + 0xf0))(pTVar4);
    bVar1 = TPZGraphMesh::Material_Is_PostProcessed(grmesh,iVar2);
    if ((dimension == 2) && (bVar1)) {
      if (iVar3 == 7) {
        this_03 = (TPZGraphElT2dMapped *)operator_new(0x28);
        TPZGraphElT2dMapped::TPZGraphElT2dMapped(this_03,(TPZCompEl *)this,grmesh);
      }
      else if (iVar3 == 9) {
        this_00 = (TPZGraphElQ2dd *)operator_new(0x28);
        TPZGraphElQ2dd::TPZGraphElQ2dd(this_00,(TPZCompEl *)this,grmesh);
      }
    }
    else if (dimension != 3 || !bVar1) {
      if (dimension == 1 && bVar1) {
        this_02 = (TPZGraphEl1dd *)operator_new(0x28);
        TPZGraphEl1dd::TPZGraphEl1dd(this_02,(TPZCompEl *)this,grmesh);
      }
    }
    else {
      switch(iVar3 - 0xfU >> 1 | (uint)((iVar3 - 0xfU & 1) != 0) << 0x1f) {
      case 0:
        this_01 = (TPZGraphElT3d *)operator_new(0x28);
        TPZGraphElT3d::TPZGraphElT3d(this_01,(TPZCompEl *)this,grmesh);
        break;
      case 2:
        this_05 = (TPZGraphElPyramidMapped *)operator_new(0x28);
        TPZGraphElPyramidMapped::TPZGraphElPyramidMapped(this_05,(TPZCompEl *)this,grmesh);
        break;
      case 3:
        this_04 = (TPZGraphElPrismMapped *)operator_new(0x28);
        TPZGraphElPrismMapped::TPZGraphElPrismMapped(this_04,(TPZCompEl *)this,grmesh);
        break;
      case 6:
        this_06 = (TPZGraphElQ3dd *)operator_new(0x28);
        TPZGraphElQ3dd::TPZGraphElQ3dd(this_06,(TPZCompEl *)this,grmesh);
      }
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CreateGraphicalElement(TPZGraphMesh &grmesh, int dimension)
{
    
    
    TPZGeoEl *ref = Reference();
    if (ref->Dimension() != dimension) {
        return;
    }
    TPZMaterial * material = Material();
    
    TPZBndCond * BDC = dynamic_cast<TPZBndCond * > (material);
    
    if (BDC) {
        return;
    }
    int matid = material->Id();
    int nsides = ref->NSides();
    bool to_postpro = grmesh.Material_Is_PostProcessed(matid);
    if(dimension == 2 && to_postpro){
        if(nsides == 9){
            new TPZGraphElQ2dd(this,&grmesh);
            return;
        }
        if(nsides == 7){
            new TPZGraphElT2dMapped(this,&grmesh);
            return;
        }
    }//2d
    
    if(dimension == 3 && to_postpro){
        if(nsides == 27){
            new TPZGraphElQ3dd(this,&grmesh);
            return;
        }//cube
        if(nsides == 21){
            new TPZGraphElPrismMapped(this,&grmesh);
            return;
        }//prism
        if(nsides == 15){
            new TPZGraphElT3d(this,&grmesh);
            return;
        }//tetra
        if(nsides == 19){
            new TPZGraphElPyramidMapped(this,&grmesh);
            return;
        }//pyram
    }//3d
    
    if(dimension == 1  && to_postpro){
        new TPZGraphEl1dd(this,&grmesh);
    }//1d
}